

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O1

void __thiscall DataFileTest::testWriteGenericByName(DataFileTest *this)

{
  long lVar1;
  long *plVar2;
  any aVar3;
  GenericRecord *this_00;
  undefined8 *puVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  placeholder *tmp;
  long lVar8;
  DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_> df;
  Pair p;
  auto_ptr<avro::DataFileWriterBase> local_78;
  string local_70;
  element_type *local_50;
  shared_count local_48;
  GenericDatum local_40;
  
  avro::DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::DataFileWriter
            ((DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_> *)&local_78,
             this->filename,&this->writerSchema,100,NULL_CODEC);
  local_50 = (this->writerSchema).root_.px;
  local_48.pi_ = (this->writerSchema).root_.pn.pi_;
  if (local_48.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_48.pi_)->use_count_ = (local_48.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_40.type_ = AVRO_NULL;
  local_40.value_.content = (placeholder *)0x0;
  avro::GenericDatum::GenericDatum((GenericDatum *)&local_70,(shared_ptr *)&this->writerSchema);
  aVar3.content = local_40.value_.content;
  local_40.type_ = (Type)local_70._M_dataplus._M_p;
  local_40.value_.content = (placeholder *)local_70._M_string_length;
  local_70._M_string_length = 0;
  if (aVar3.content != (placeholder *)0x0) {
    (*(aVar3.content)->_vptr_placeholder[1])();
  }
  if ((long *)local_70._M_string_length != (long *)0x0) {
    (**(code **)(*(long *)local_70._M_string_length + 8))();
  }
  this_00 = boost::any_cast<avro::GenericRecord>(&local_40.value_);
  lVar7 = 5;
  lVar8 = 3;
  do {
    puVar4 = (undefined8 *)operator_new(0x10);
    *puVar4 = &PTR__placeholder_001ba180;
    puVar4[1] = lVar8;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"re","");
    sVar5 = avro::GenericRecord::fieldIndex(this_00,&local_70);
    lVar1 = *(long *)(this_00 + 0x10);
    lVar6 = sVar5 * 0x10;
    *(undefined4 *)(lVar1 + lVar6) = 3;
    plVar2 = *(long **)(lVar1 + 8 + lVar6);
    *(undefined8 **)(lVar1 + 8 + lVar6) = puVar4;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    puVar4 = (undefined8 *)operator_new(0x10);
    *puVar4 = &PTR__placeholder_001ba180;
    puVar4[1] = lVar7;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"im","");
    sVar5 = avro::GenericRecord::fieldIndex(this_00,&local_70);
    lVar1 = *(long *)(this_00 + 0x10);
    lVar6 = sVar5 * 0x10;
    *(undefined4 *)(lVar1 + lVar6) = 3;
    plVar2 = *(long **)(lVar1 + 8 + lVar6);
    *(undefined8 **)(lVar1 + 8 + lVar6) = puVar4;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    avro::DataFileWriterBase::syncIfNeeded();
    avro::GenericWriter::write(*(Encoder **)(local_78._M_ptr + 0x30),&local_40);
    *(long *)(local_78._M_ptr + 0x70) = *(long *)(local_78._M_ptr + 0x70) + 1;
    lVar8 = lVar8 * lVar7;
    lVar7 = lVar7 + 3;
  } while ((int)lVar7 != 0xbbd);
  avro::DataFileWriterBase::close();
  if (local_40.value_.content != (placeholder *)0x0) {
    (*(local_40.value_.content)->_vptr_placeholder[1])();
  }
  boost::detail::shared_count::~shared_count(&local_48);
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&local_78);
  return;
}

Assistant:

void testWriteGenericByName() {
        avro::DataFileWriter<Pair> df(filename, writerSchema, 100);
        int64_t re = 3;
        int64_t im = 5;
        Pair p(writerSchema, GenericDatum());

        GenericDatum& c = p.second;
        c = GenericDatum(writerSchema.root());
        GenericRecord& r = c.value<GenericRecord>();

        for (int i = 0; i < count; ++i, re *= im, im += 3) {
            r.field("re") = re;
            r.field("im") = im;
            df.write(p);
        }
        df.close();
    }